

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async_blocking_timeout.cpp
# Opt level: O2

bool __thiscall Client::ReadResponse(Client *this)

{
  ulong_long_type uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  error_category *peVar4;
  ostream *poVar5;
  error_code eVar6;
  error_code ec;
  io_op<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_sprinfall[P]boost_asio_study_src_ssl_http_client_async_blocking_timeout_cpp:260:7)>
  local_70;
  
  local_70.next_layer_ =
       (basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)0x12a05f200;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::expires_after(&this->deadline_,(duration *)&local_70);
  ec = boost::asio::error::make_error_code(try_again);
  local_70.handler_.ec = &ec;
  local_70.next_layer_ = &(this->ssl_socket_).next_layer_;
  local_70.op_.buffers_.data_ =
       (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_70.op_.buffers_.size_ =
       (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)local_70.op_.buffers_.data_;
  if (local_70.op_.buffers_.size_ == 0) {
    local_70.op_.buffers_.data_ = (pointer)0x0;
  }
  local_70.core_ = &(this->ssl_socket_).core_;
  local_70._32_5_ = 0;
  local_70.want_._1_3_ = want_nothing >> 8;
  local_70.ec_.val_ = 0;
  local_70.ec_.failed_ = false;
  local_70.ec_.cat_ = boost::system::system_category();
  local_70.bytes_transferred_ = 0;
  local_70.handler_.this = this;
  peVar4 = boost::system::system_category();
  auVar2._8_8_ = 0;
  auVar2._0_8_ = peVar4;
  boost::asio::ssl::detail::
  io_op<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/sprinfall[P]boost-asio-study/src/ssl_http_client_async_blocking_timeout.cpp:260:7)>
  ::operator()(&local_70,(error_code)(auVar2 << 0x40),0,1);
  do {
    boost::asio::io_context::run_one(&this->io_context_);
    eVar6 = boost::asio::error::make_error_code(try_again);
    if (ec.val_ != eVar6.val_) break;
    uVar1 = (eVar6.cat_)->id_;
    bVar3 = (ec.cat_)->id_ == uVar1;
    if (uVar1 == 0) {
      bVar3 = ec.cat_ == eVar6.cat_;
    }
  } while (bVar3);
  bVar3 = ec.failed_;
  if (ec.failed_ == true) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Read failed: ");
    (*(ec.cat_)->_vptr_error_category[4])(&local_70,ec.cat_,(ulong)(uint)ec.val_);
    poVar5 = std::operator<<(poVar5,(string *)&local_70);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool Client::ReadResponse() {
  deadline_.expires_after(std::chrono::seconds(kMaxReceiveSeconds));

  boost::system::error_code ec = boost::asio::error::would_block;

  ssl_socket_.async_read_some(
      boost::asio::buffer(buffer_),
      [this, &ec](boost::system::error_code inner_ec, std::size_t length) {
        ec = inner_ec;

        if (inner_ec || length == 0) {
          std::cout << "Socket read error." << std::endl;
          return;
        }

        std::cout.write(buffer_.data(), length);

        // TODO: Call ReadResponse() to read until the end.
        ReadResponse();
      });

  // Block until the asynchronous operation has completed.
  do {
    io_context_.run_one();
  } while (ec == boost::asio::error::would_block);

  if (ec) {
    std::cout << "Read failed: " << ec.message() << std::endl;
    return false;
  }

  return true;
}